

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::FixIndentation::setIndents
          (FixIndentation *this,Fodder *fodder,uint all_but_last_indent,uint last_indent)

{
  bool bVar1;
  iterator __lhs;
  uint in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  FodderElement *f_1;
  iterator __end2_1;
  iterator __begin2_1;
  Fodder *__range2_1;
  uint i;
  FodderElement *f;
  iterator __end2;
  iterator __begin2;
  Fodder *__range2;
  uint count;
  reference in_stack_ffffffffffffff98;
  __normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
  *in_stack_ffffffffffffffa0;
  __normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
  local_58;
  undefined8 local_50;
  int local_44;
  reference local_40;
  FodderElement *local_38;
  __normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
  local_30 [2];
  uint local_1c;
  uint local_18;
  uint local_14;
  undefined8 local_10;
  
  local_1c = 0;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_30[0]._M_current =
       (FodderElement *)
       std::
       vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
       begin((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)in_stack_ffffffffffffff98);
  local_38 = (FodderElement *)
             std::
             vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ::end((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                    *)in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffa0,
                       (__normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    local_40 = __gnu_cxx::
               __normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
               ::operator*(local_30);
    if (local_40->kind != INTERSTITIAL) {
      local_1c = local_1c + 1;
    }
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
    ::operator++(local_30);
  }
  local_44 = 0;
  local_50 = local_10;
  local_58._M_current =
       (FodderElement *)
       std::
       vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
       begin((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)in_stack_ffffffffffffff98);
  __lhs = std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::end((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 *)in_stack_ffffffffffffff98);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) {
      return;
    }
    in_stack_ffffffffffffff98 =
         __gnu_cxx::
         __normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
         ::operator*(&local_58);
    if (in_stack_ffffffffffffff98->kind != INTERSTITIAL) {
      if (local_44 + 1U < local_1c) {
        in_stack_ffffffffffffff98->indent = local_14;
      }
      else {
        if (local_44 != local_1c - 1) {
          __assert_fail("i == count - 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/formatter.cpp"
                        ,0x593,
                        "void jsonnet::internal::FixIndentation::setIndents(Fodder &, unsigned int, unsigned int)"
                       );
        }
        in_stack_ffffffffffffff98->indent = local_18;
      }
      local_44 = local_44 + 1;
    }
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
    ::operator++(&local_58);
  } while( true );
}

Assistant:

void setIndents(Fodder &fodder, unsigned all_but_last_indent, unsigned last_indent)
    {
        // First count how many there are.
        unsigned count = 0;
        for (const auto &f : fodder) {
            if (f.kind != FodderElement::INTERSTITIAL)
                count++;
        }
        // Now set the indents.
        unsigned i = 0;
        for (auto &f : fodder) {
            if (f.kind != FodderElement::INTERSTITIAL) {
                if (i + 1 < count) {
                    f.indent = all_but_last_indent;
                } else {
                    assert(i == count - 1);
                    f.indent = last_indent;
                }
                i++;
            }
        }
    }